

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_201151b::RawTRDescriptor::~RawTRDescriptor(RawTRDescriptor *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorImpl::~DescriptorImpl(&this->super_DescriptorImpl);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x58);
    return;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript> scripts, FlatSigningProvider& out) const override
    {
        assert(keys.size() == 1);
        XOnlyPubKey xpk(keys[0]);
        if (!xpk.IsFullyValid()) return {};
        WitnessV1Taproot output{xpk};
        return Vector(GetScriptForDestination(output));
    }